

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O3

int xreq0_pipe_init(void *arg,nni_pipe *pipe,void *s)

{
  nni_aio_init((nni_aio *)((long)arg + 0x10),xreq0_getq_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x568),xreq0_putq_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x3a0),xreq0_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x1d8),xreq0_send_cb,arg);
  *(nni_pipe **)arg = pipe;
  *(void **)((long)arg + 8) = s;
  return 0;
}

Assistant:

static int
xreq0_pipe_init(void *arg, nni_pipe *pipe, void *s)
{
	xreq0_pipe *p = arg;

	nni_aio_init(&p->aio_getq, xreq0_getq_cb, p);
	nni_aio_init(&p->aio_putq, xreq0_putq_cb, p);
	nni_aio_init(&p->aio_recv, xreq0_recv_cb, p);
	nni_aio_init(&p->aio_send, xreq0_send_cb, p);

	p->pipe = pipe;
	p->req  = s;
	return (0);
}